

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void YCSB_F(size_t number,K *random_keys,TestIndex *test_index)

{
  double key;
  unsigned_long __res;
  void *pvVar1;
  Zipfian *this;
  size_t sVar2;
  ulong uVar3;
  void *pvVar4;
  result_type_conflict rVar5;
  result_type rVar6;
  ostream *poVar7;
  size_t __i;
  size_t i;
  long lVar8;
  size_t i_1;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar12;
  undefined1 auVar11 [16];
  undefined8 in_XMM3_Qb;
  uniform_int_distribution<unsigned_long> dist_temp;
  timeval t1;
  uniform_int_distribution<long> payload_dist;
  timeval t2;
  mt19937 gen_temp;
  mt19937 payload_gen;
  uniform_int_distribution<unsigned_long> local_2780;
  timeval local_2770;
  uniform_int_distribution<long> local_2760;
  timeval local_2750;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Preparing workloads...",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  pvVar1 = operator_new__(800000000);
  this = (Zipfian *)operator_new(0x13c8);
  Zipfian::Zipfian(this,number);
  lVar8 = 0;
  do {
    sVar2 = Zipfian::next(this);
    *(K *)((long)pvVar1 + lVar8 * 8) = random_keys[sVar2];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 100000000);
  std::
  _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
               *)this);
  operator_delete(this,0x13c8);
  local_2760._M_param._M_a = -1000000000;
  local_2760._M_param._M_b = 1000000000;
  local_13b8._M_x[0] = time((time_t *)0x0);
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffff;
  lVar8 = 1;
  uVar3 = local_13b8._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar8);
    local_13b8._M_x[lVar8] = uVar3;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_13b8._M_p = 0x270;
  pvVar4 = operator_new__(800000000);
  lVar8 = 0;
  do {
    rVar5 = std::uniform_int_distribution<long>::operator()
                      (&local_2760,&local_13b8,&local_2760._M_param);
    *(result_type_conflict *)((long)pvVar4 + lVar8 * 8) = rVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 100000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Warming up...",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  local_2780._M_param._M_b = number - 1;
  local_2780._M_param._M_a = 0;
  local_2740._M_x[0] = time((time_t *)0x0);
  local_2740._M_x[0] = local_2740._M_x[0] & 0xffffffff;
  lVar8 = 1;
  uVar3 = local_2740._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar8);
    local_2740._M_x[lVar8] = uVar3;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_2740._M_p = 0x270;
  lVar8 = 100000000;
  do {
    rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_2780,&local_2740,&local_2780._M_param);
    BufferIndex<double,_long>::find(test_index,random_keys[rVar6]);
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Start doing YCSB-F benchmark...",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  lVar8 = 0;
  uVar12 = extraout_XMM1_Qb;
  gettimeofday(&local_2770,(__timezone_ptr_t)0x0);
  do {
    key = *(double *)((long)pvVar1 + lVar8 * 8);
    BufferIndex<double,_long>::find(test_index,key);
    BufferIndex<double,_long>::upsert(test_index,key,*(long *)((long)pvVar4 + lVar8 * 8));
    lVar8 = lVar8 + 1;
  } while (lVar8 != 100000000);
  gettimeofday(&local_2750,(__timezone_ptr_t)0x0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total time: ",0xc);
  auVar9._0_8_ = (double)local_2750.tv_sec;
  auVar9._8_8_ = uVar12;
  auVar11._0_8_ = (double)local_2750.tv_usec;
  auVar11._8_8_ = uVar12;
  auVar9 = vfmadd231sd_fma(auVar11,ZEXT816(0x412e848000000000),auVar9);
  auVar10._0_8_ = (double)local_2770.tv_sec;
  auVar10._8_8_ = in_XMM3_Qb;
  auVar9 = vfnmadd213sd_fma(auVar10,ZEXT816(0x412e848000000000),auVar9);
  poVar7 = std::ostream::_M_insert<double>((auVar9._0_8_ - (double)local_2770.tv_usec) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ms",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  operator_delete__(pvVar1);
  operator_delete__(pvVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"YCSB-F benchmark complete!",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void YCSB_F(const size_t number, const K* random_keys, TestIndex& test_index) {
    size_t transactions = 2e8;
    size_t times = transactions >> 1;

    std::cout<<"Preparing workloads..."<<std::endl;
    K* search_keys = new K[times];
    auto* zipfian = new Zipfian(number);
    for (size_t i = 0; i < times; i++) {
        search_keys[i] = random_keys[zipfian->next()];
    }
    delete zipfian;
    std::uniform_int_distribution<P> payload_dist(-1e9,1e9);
    std::mt19937 payload_gen(time(NULL));
    P* new_payloads = new P[times];
    for (size_t i = 0; i < times; i++) {
        new_payloads[i] = payload_dist(payload_gen);
    }
    timeval t1, t2;
    P* search_answers = new P[times];

    std::cout<<"Warming up..."<<std::endl;
    std::uniform_int_distribution<size_t> dist_temp(0, number - 1);
    std::mt19937 gen_temp(time(NULL));
    for (size_t i = 0; i < 1e8; i++) {
        test_index.find(random_keys[dist_temp(gen_temp)]);
    }

    std::cout<<"Start doing YCSB-F benchmark..."<<std::endl;
    gettimeofday(&t1, NULL);
    for(size_t i = 0; i < times; i++){
        search_answers[i] = test_index.find(search_keys[i]);
        test_index.upsert(search_keys[i], new_payloads[i]);
    }
    gettimeofday(&t2, NULL);
    std::cout<<"Total time: "<<(t2.tv_sec*1e6+t2.tv_usec-t1.tv_sec*1e6-t1.tv_usec)/1000<<" ms"<<std::endl;
    delete [] search_keys;
    delete [] search_answers;
    delete [] new_payloads;
    std::cout<<"YCSB-F benchmark complete!"<<std::endl;
}